

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_elements_input_init_alloc
              (uchar *txhash,size_t txhash_len,uint32_t utxo_index,uint32_t sequence,uchar *script,
              size_t script_len,wally_tx_witness_stack *witness,uchar *nonce,size_t nonce_len,
              uchar *entropy,size_t entropy_len,uchar *issuance_amount,size_t issuance_amount_len,
              uchar *inflation_keys,size_t inflation_keys_len,uchar *issuance_amount_rangeproof,
              size_t issuance_amount_rangeproof_len,uchar *inflation_keys_rangeproof,
              size_t inflation_keys_rangeproof_len,wally_tx_witness_stack *pegin_witness,
              wally_tx_input **output)

{
  int iVar1;
  wally_tx_input *output_00;
  
  if (output == (wally_tx_input **)0x0) {
    iVar1 = -2;
  }
  else {
    *output = (wally_tx_input *)0x0;
    output_00 = (wally_tx_input *)wally_calloc(0xd0);
    *output = output_00;
    if (output_00 == (wally_tx_input *)0x0) {
      iVar1 = -3;
    }
    else {
      iVar1 = tx_elements_input_init
                        (txhash,txhash_len,utxo_index,sequence,script,script_len,witness,nonce,
                         nonce_len,entropy,entropy_len,issuance_amount,issuance_amount_len,
                         inflation_keys,inflation_keys_len,issuance_amount_rangeproof,
                         issuance_amount_rangeproof_len,inflation_keys_rangeproof,
                         inflation_keys_rangeproof_len,pegin_witness,output_00,true);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        clear_and_free(output_00,0xd0);
        *output = (wally_tx_input *)0x0;
      }
    }
  }
  return iVar1;
}

Assistant:

int wally_tx_elements_input_init_alloc(
    const unsigned char *txhash, size_t txhash_len,
    uint32_t utxo_index, uint32_t sequence,
    const unsigned char *script, size_t script_len,
    const struct wally_tx_witness_stack *witness,
    const unsigned char *nonce, size_t nonce_len,
    const unsigned char *entropy, size_t entropy_len,
    const unsigned char *issuance_amount, size_t issuance_amount_len,
    const unsigned char *inflation_keys, size_t inflation_keys_len,
    const unsigned char *issuance_amount_rangeproof, size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof, size_t inflation_keys_rangeproof_len,
    const struct wally_tx_witness_stack *pegin_witness,
    struct wally_tx_input **output)
{
    struct wally_tx_input *result;
    int ret;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx_input);

    ret = tx_elements_input_init(txhash, txhash_len, utxo_index, sequence,
                                 script, script_len, witness,
                                 nonce, nonce_len, entropy, entropy_len,
                                 issuance_amount, issuance_amount_len,
                                 inflation_keys, inflation_keys_len,
                                 issuance_amount_rangeproof,
                                 issuance_amount_rangeproof_len,
                                 inflation_keys_rangeproof,
                                 inflation_keys_rangeproof_len, pegin_witness,
                                 result, true);

    if (ret != WALLY_OK) {
        clear_and_free(result, sizeof(*result));
        *output = NULL;
    }
    return ret;
}